

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  Dch_Pars_t *pPars;
  Dch_Pars_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._56_8_ = argv;
  pAVar3 = Abc_FrameReadNtk(pAbc);
  Dch_ManSetDefaultParams((Dch_Pars_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_0027bf9b:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._56_8_,"WCSsptgcfrvh");
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar3);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command works only for strashed networks.\n");
        return 1;
      }
      pAVar3 = Abc_NtkDch(pAVar3,(Dch_Pars_t *)&pPars);
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Command has failed.\n");
        return 0;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0027c25e;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._56_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    default:
      goto LAB_0027c25e;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_0027c25e;
      }
      Pars.nWords = atoi(*(char **)(Pars._56_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nWords;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_0027c25e;
      }
      pPars._0_4_ = atoi(*(char **)(Pars._56_8_ + (long)globalUtilOptind * 8));
      uVar2 = (uint)pPars;
      break;
    case 99:
      Pars.fPower = Pars.fPower ^ 1;
      goto LAB_0027bf9b;
    case 0x66:
      Pars.fUseGia = Pars.fUseGia ^ 1;
      goto LAB_0027bf9b;
    case 0x67:
      Pars.fSimulateTfo = Pars.fSimulateTfo ^ 1;
      goto LAB_0027bf9b;
    case 0x68:
      goto LAB_0027c25e;
    case 0x70:
      Pars.fPolarFlip = Pars.fPolarFlip ^ 1;
      goto LAB_0027bf9b;
    case 0x72:
      Pars.fUseCSat = Pars.fUseCSat ^ 1;
      goto LAB_0027bf9b;
    case 0x73:
      Pars.nBTLimit = Pars.nBTLimit ^ 1;
      goto LAB_0027bf9b;
    case 0x74:
      Pars.fSynthesis = Pars.fSynthesis ^ 1;
      goto LAB_0027bf9b;
    case 0x76:
      Pars.fLightSynth = Pars.fLightSynth ^ 1;
      goto LAB_0027bf9b;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_0027c25e:
      Abc_Print(-2,"usage: dch [-WCS num] [-sptgcfrvh]\n");
      Abc_Print(-2,"\t         computes structural choices using a new approach\n");
      Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      pcVar4 = "no";
      if (Pars.nBTLimit != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle synthesizing three snapshots [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fPolarFlip != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-p     : toggle power-aware rewriting [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fSynthesis != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fSimulateTfo != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-g     : toggle using GIA to prove equivalences [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fPower != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based SAT vs. MiniSat [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fUseGia != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-f     : toggle using faster logic synthesis [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fUseCSat != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggle skipping choices with redundant support [default = %s]\n",
                pcVar4);
      pcVar4 = "no";
      if (Pars.fLightSynth != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Dch_Pars_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    extern Abc_Ntk_t * Abc_NtkDch( Abc_Ntk_t * pNtk, Dch_Pars_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCSsptgcfrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 's':
            pPars->fSynthesis ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'g':
            pPars->fUseGia ^= 1;
            break;
        case 'c':
            pPars->fUseCSat ^= 1;
            break;
        case 'f':
            pPars->fLightSynth ^= 1;
            break;
        case 'r':
            pPars->fSkipRedSupp ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDch( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dch [-WCS num] [-sptgcfrvh]\n" );
    Abc_Print( -2, "\t         computes structural choices using a new approach\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-s     : toggle synthesizing three snapshots [default = %s]\n", pPars->fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle power-aware rewriting [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle using GIA to prove equivalences [default = %s]\n", pPars->fUseGia? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT vs. MiniSat [default = %s]\n", pPars->fUseCSat? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle using faster logic synthesis [default = %s]\n", pPars->fLightSynth? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle skipping choices with redundant support [default = %s]\n", pPars->fSkipRedSupp? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}